

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::GetSelectedCommissioner
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner)

{
  bool bVar1;
  element_type *this_00;
  pointer ppVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  format_args args;
  ErrorCode local_2c4;
  Error local_2c0;
  ErrorCode local_294;
  Error local_290;
  undefined1 local_268 [8];
  CommissionerAppPtr commissioner;
  Config conf;
  _Self local_150;
  iterator entry;
  v10 *local_140;
  size_t local_138;
  string local_130;
  Error local_110;
  Status local_d1;
  uint64_t uStack_d0;
  RegistryStatus status;
  uint64_t nid;
  CommissionerAppPtr *local_c0;
  CommissionerAppPtr *aCommissioner_local;
  JobManager *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  nid._7_1_ = 0;
  local_c0 = aCommissioner;
  aCommissioner_local = (CommissionerAppPtr *)this;
  this_local = (JobManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mInterpreter->mRegistry);
  local_d1 = persistent_storage::Registry::GetCurrentNetworkXpan(this_00,&stack0xffffffffffffff30);
  if (local_d1 == kSuccess) {
    if (uStack_d0 == 0) {
      std::shared_ptr<ot::commissioner::CommissionerApp>::operator=
                (local_c0,&this->mDefaultCommissioner);
    }
    else {
      local_150._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
           ::find(&this->mCommissionerPool,&stack0xffffffffffffff30);
      conf.mThreadSMRoot.field_2._8_8_ =
           std::
           map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
           ::end(&this->mCommissionerPool);
      bVar1 = std::operator!=(&local_150,(_Self *)((long)&conf.mThreadSMRoot.field_2 + 8));
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
                 ::operator->(&local_150);
        std::shared_ptr<ot::commissioner::CommissionerApp>::operator=(local_c0,&ppVar2->second);
      }
      else {
        Config::Config((Config *)
                       &commissioner.
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,&this->mDefaultConf);
        std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
                  ((shared_ptr<ot::commissioner::CommissionerApp> *)local_268,(nullptr_t)0x0);
        PrepareDtlsConfig(&local_290,this,uStack_d0,
                          (Config *)
                          &commissioner.
                           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_290);
        local_294 = kNone;
        bVar1 = commissioner::operator!=(pEVar3,&local_294);
        Error::~Error(&local_290);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          CommissionerAppCreate
                    (&local_2c0,(shared_ptr<ot::commissioner::CommissionerApp> *)local_268,
                     (Config *)
                     &commissioner.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          pEVar3 = Error::operator=(__return_storage_ptr__,&local_2c0);
          local_2c4 = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_2c4);
          Error::~Error(&local_2c0);
          if (bVar1) {
            bVar1 = true;
          }
          else {
            pmVar4 = std::
                     map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                     ::operator[](&this->mCommissionerPool,&stack0xffffffffffffff30);
            std::shared_ptr<ot::commissioner::CommissionerApp>::operator=
                      (pmVar4,(shared_ptr<ot::commissioner::CommissionerApp> *)local_268);
            pmVar4 = std::
                     map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                     ::operator[](&this->mCommissionerPool,&stack0xffffffffffffff30);
            std::shared_ptr<ot::commissioner::CommissionerApp>::operator=(local_c0,pmVar4);
            bVar1 = false;
          }
        }
        std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
                  ((shared_ptr<ot::commissioner::CommissionerApp> *)local_268);
        Config::~Config((Config *)
                        &commissioner.
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
        if ((bVar1) && (!bVar1)) goto LAB_003b7b2b;
      }
    }
  }
  else {
    GetSelectedCommissioner::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&entry._M_node + 6));
    local_58 = &local_140;
    local_60 = (v10 *)((long)&entry._M_node + 7);
    bVar5 = ::fmt::v10::operator()(local_60);
    local_138 = bVar5.size_;
    local_140 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_130;
    local_78 = local_140;
    sStack_70 = local_138;
    local_50 = &local_78;
    local_88 = local_140;
    local_80 = local_138;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_130,local_88,fmt,args);
    Error::Error(&local_110,kRegistryError,&local_130);
    Error::operator=(__return_storage_ptr__,&local_110);
    Error::~Error(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  nid._7_1_ = 1;
LAB_003b7b2b:
  if ((nid._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::GetSelectedCommissioner(CommissionerAppPtr &aCommissioner)
{
    Error          error = ERROR_NONE;
    uint64_t       nid;
    RegistryStatus status;

    status = mInterpreter.mRegistry->GetCurrentNetworkXpan(nid);
    VerifyOrExit(RegistryStatus::kSuccess == status, error = ERROR_REGISTRY_ERROR("getting selected network failed"));

    if (nid != 0)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry != mCommissionerPool.end())
        {
            aCommissioner = entry->second;
        }
        else
        {
            Config             conf         = mDefaultConf;
            CommissionerAppPtr commissioner = nullptr;

            SuccessOrExit(error = PrepareDtlsConfig(nid, conf));
            SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
            mCommissionerPool[nid] = commissioner;
            aCommissioner          = mCommissionerPool[nid];
        }
    }
    else
    {
        aCommissioner = mDefaultCommissioner;
    }
exit:
    return error;
}